

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall Assimp::IFC::Schema_2x3::IfcBSplineCurve::~IfcBSplineCurve(IfcBSplineCurve *this)

{
  long *plVar1;
  _func_int *p_Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  long *plVar4;
  void *pvVar5;
  
  p_Var2 = (this->super_IfcBoundedCurve).super_IfcCurve.super_IfcGeometricRepresentationItem.
           super_IfcRepresentationItem.
           super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
           _vptr_ObjectHelper[0xfffffffffffffffd];
  *(undefined8 *)
   ((long)&(this->super_IfcBoundedCurve).super_IfcCurve.super_IfcGeometricRepresentationItem.
           super_IfcRepresentationItem.
           super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
           _vptr_ObjectHelper + (long)p_Var2) = 0x9629d8;
  *(undefined8 *)(&this->field_0xb0 + (long)p_Var2) = 0x962aa0;
  *(undefined8 *)
   (&(this->super_IfcBoundedCurve).super_IfcCurve.super_IfcGeometricRepresentationItem.
     super_IfcRepresentationItem.
     super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 +
   (long)p_Var2) = 0x962a00;
  *(undefined8 *)
   (&(this->super_IfcBoundedCurve).super_IfcCurve.super_IfcGeometricRepresentationItem.
     super_IfcRepresentationItem.
     super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 +
   (long)p_Var2) = 0x962a28;
  *(undefined8 *)
   (&(this->super_IfcBoundedCurve).super_IfcCurve.super_IfcGeometricRepresentationItem.field_0x30 +
   (long)p_Var2) = 0x962a50;
  *(undefined8 *)(&(this->super_IfcBoundedCurve).super_IfcCurve.field_0x40 + (long)p_Var2) =
       0x962a78;
  p_Var3 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
            ((long)&(this->SelfIntersect).
                    super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi + (long)p_Var2);
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
  }
  p_Var3 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
            ((long)&(this->ClosedCurve).
                    super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi + (long)p_Var2);
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
  }
  plVar4 = *(long **)((long)&(this->CurveForm)._M_dataplus._M_p + (long)p_Var2);
  plVar1 = (long *)((this->CurveForm).field_2._M_local_buf + (long)p_Var2);
  if (plVar4 != plVar1) {
    operator_delete(plVar4,*plVar1 + 1);
  }
  pvVar5 = *(void **)((long)&(this->ControlPointsList).
                             super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcCartesianPoint>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcCartesianPoint>_>_>
                             .
                             super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcCartesianPoint>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcCartesianPoint>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + (long)p_Var2);
  if (pvVar5 != (void *)0x0) {
    operator_delete(pvVar5,*(long *)((long)&(this->ControlPointsList).
                                            super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcCartesianPoint>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcCartesianPoint>_>_>
                                            .
                                            super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcCartesianPoint>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcCartesianPoint>_>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage +
                                    (long)p_Var2) - (long)pvVar5);
    return;
  }
  return;
}

Assistant:

IfcBSplineCurve() : Object("IfcBSplineCurve") {}